

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CodedOutputStream::Skip(CodedOutputStream *this,int count)

{
  bool bVar1;
  int local_1c;
  int count_local;
  CodedOutputStream *this_local;
  
  local_1c = count;
  if (-1 < count) {
    do {
      if (local_1c <= this->buffer_size_) {
        Advance(this,local_1c);
        return true;
      }
      local_1c = local_1c - this->buffer_size_;
      bVar1 = Refresh(this);
    } while (bVar1);
  }
  return false;
}

Assistant:

bool CodedOutputStream::Skip(int count) {
  if (count < 0) return false;

  while (count > buffer_size_) {
    count -= buffer_size_;
    if (!Refresh()) return false;
  }

  Advance(count);
  return true;
}